

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesGroupInfo.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XercesGroupInfo::XercesGroupInfo(XercesGroupInfo *this,MemoryManager *manager)

{
  RefVectorOf<xercesc_4_0::SchemaElementDecl> *this_00;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesGroupInfo_00408340;
  this->fCheckElementConsistency = true;
  this->fScope = 0xfffffffe;
  this->fNameId = 0;
  this->fNamespaceId = 0;
  this->fContentSpec = (ContentSpecNode *)0x0;
  this->fElements = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0;
  this->fBaseGroup = (XercesGroupInfo *)0x0;
  this->fLocator = (XSDLocator *)0x0;
  this_00 = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)XMemory::operator_new(0x30,manager);
  RefVectorOf<xercesc_4_0::SchemaElementDecl>::RefVectorOf(this_00,4,false,manager);
  this->fElements = this_00;
  return;
}

Assistant:

XercesGroupInfo::XercesGroupInfo(MemoryManager* const manager)
    : fCheckElementConsistency(true)
    , fScope(Grammar::TOP_LEVEL_SCOPE)
    , fNameId(0)
    , fNamespaceId(0)
    , fContentSpec(0)
    , fElements(0)
    , fBaseGroup(0)
    , fLocator(0)
{
    fElements = new (manager) RefVectorOf<SchemaElementDecl>(4, false, manager);
}